

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Erf::backward_impl
          (Erf *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar12;
  ulong uVar13;
  Index index;
  uint uVar14;
  ulong uVar15;
  Index index_1;
  ulong uVar16;
  ushort uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  int iVar42;
  int iVar43;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  ulong uVar11;
  
  iVar43 = 1;
  iVar42 = 1;
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)(pTVar1->d).nd;
  if (uVar11 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar17 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar15));
      auVar24._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar20._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar20._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar20._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar20._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar20._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar20._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar20._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar24,auVar25);
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar15);
    auVar21 = vmovdqa32_avx512f(auVar20);
    auVar20._0_4_ = (uint)(bVar8 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar5 * auVar21._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar5 * auVar21._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar5 * auVar21._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar5 * auVar21._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar5 * auVar21._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar5 * auVar21._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar5 * auVar21._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar20._32_4_ = (uint)(bVar9 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar9 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar5 * auVar21._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar9 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar5 * auVar21._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar9 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar5 * auVar21._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar9 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar5 * auVar21._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar9 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar5 * auVar21._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar9 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar5 * auVar21._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar20._60_4_ =
         (uint)(bVar9 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar20,1);
    auVar20 = vpmulld_avx512f(auVar20,ZEXT3264(auVar19));
    auVar18 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar18,0xee);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    auVar6 = vpshufd_avx(auVar18,0x55);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    iVar42 = auVar18._0_4_;
  }
  uVar14 = iVar42 * (pTVar1->d).bd;
  uVar11 = (ulong)(dEdf->d).nd;
  if (uVar11 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar17 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar15));
      auVar26._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar20._4_4_;
      auVar26._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar20._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar20._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar20._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar20._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar20._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar20._28_4_;
      auVar26._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar26._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar26._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar26._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar26._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar26._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar26._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar26._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar26,auVar25);
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar15);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar21._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar21._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar9 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar9 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar9 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar9 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar9 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar9 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar21._60_4_ =
         (uint)(bVar9 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar21,1);
    auVar20 = vpmulld_avx512f(auVar21,ZEXT3264(auVar19));
    auVar18 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar18,0xee);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    auVar6 = vpshufd_avx(auVar18,0x55);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    iVar43 = auVar18._0_4_;
  }
  if (uVar14 != iVar43 * (dEdf->d).bd) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<cnn::scalar_erf_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::scalar_erf_backward_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar11 = (ulong)(dEdxi->d).nd;
  if (uVar11 == 0) {
    iVar42 = 1;
  }
  else {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar17 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar15));
      auVar27._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar20._4_4_;
      auVar27._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar20._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar20._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar20._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar20._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar20._24_4_;
      auVar27._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar20._28_4_;
      auVar27._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar27._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar27._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar27._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar27._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar27._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar27._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar27._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar20 = vpmulld_avx512f(auVar27,auVar25);
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar15);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar22._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * auVar25._4_4_;
    bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * auVar25._8_4_;
    bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * auVar25._12_4_;
    bVar5 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * auVar25._16_4_;
    bVar5 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * auVar25._20_4_;
    bVar5 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * auVar25._24_4_;
    bVar5 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * auVar25._28_4_;
    auVar22._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar5 = (bool)(bVar9 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar5 * auVar20._36_4_ | (uint)!bVar5 * auVar25._36_4_;
    bVar5 = (bool)(bVar9 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar5 * auVar20._40_4_ | (uint)!bVar5 * auVar25._40_4_;
    bVar5 = (bool)(bVar9 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar5 * auVar20._44_4_ | (uint)!bVar5 * auVar25._44_4_;
    bVar5 = (bool)(bVar9 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar5 * auVar20._48_4_ | (uint)!bVar5 * auVar25._48_4_;
    bVar5 = (bool)(bVar9 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar5 * auVar20._52_4_ | (uint)!bVar5 * auVar25._52_4_;
    bVar5 = (bool)(bVar9 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar5 * auVar20._56_4_ | (uint)!bVar5 * auVar25._56_4_;
    auVar22._60_4_ =
         (uint)(bVar9 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar22,1);
    auVar20 = vpmulld_avx512f(auVar22,ZEXT3264(auVar19));
    auVar18 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar18,0xee);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    auVar6 = vpshufd_avx(auVar18,0x55);
    auVar18 = vpmulld_avx(auVar18,auVar6);
    iVar42 = auVar18._0_4_;
  }
  uVar10 = iVar42 * (dEdxi->d).bd;
  uVar11 = (ulong)uVar10;
  if (uVar10 != uVar14) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::scalar_erf_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar2 = dEdxi->v;
  uVar15 = uVar11;
  if ((((ulong)pfVar2 & 3) == 0) &&
     (uVar15 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 0xf), uVar11 <= uVar15)) {
    uVar15 = uVar11;
  }
  pfVar3 = pTVar1->v;
  pfVar4 = dEdf->v;
  uVar12 = uVar11 - uVar15;
  uVar16 = uVar12 + 0xf;
  if (-1 < (long)uVar12) {
    uVar16 = uVar12;
  }
  if (uVar15 != 0) {
    uVar13 = 0;
    do {
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar18 = vxorps_avx512vl(ZEXT416((uint)pfVar3[uVar13]),auVar18);
      auVar23._0_4_ = expf(pfVar3[uVar13] * auVar18._0_4_);
      auVar23._4_60_ = extraout_var;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)(pfVar4[uVar13] * 1.1283792)),auVar23._0_16_,
                                ZEXT416((uint)pfVar2[uVar13]));
      pfVar2[uVar13] = auVar18._0_4_;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  uVar16 = (uVar16 & 0xfffffffffffffff0) + uVar15;
  if (0xf < (long)uVar12) {
    auVar20 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
    auVar21 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
    auVar22 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    auVar23 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar24 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
    auVar25 = vbroadcastss_avx512f(ZEXT416(0x39506967));
    auVar26 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
    auVar28 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar30 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
    auVar31 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
    auVar32 = vbroadcastss_avx512f(ZEXT416(0x3f906ebb));
    auVar33 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    do {
      auVar34 = vxorps_avx512dq(*(undefined1 (*) [64])(pfVar3 + uVar15),auVar33);
      auVar34 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar15),auVar34);
      auVar35 = vminps_avx512f(auVar34,auVar20);
      auVar35 = vmaxps_avx512f(auVar35,auVar21);
      auVar36 = vfmadd231ps_avx512f(auVar22,auVar35,auVar23);
      auVar36 = vrndscaleps_avx512f(auVar36,1);
      auVar35 = vfmadd231ps_avx512f(auVar35,auVar36,auVar24);
      auVar37 = vfmadd213ps_avx512f(auVar25,auVar35,auVar26);
      auVar38 = vfmadd213ps_avx512f(auVar27,auVar35,auVar28);
      auVar39 = vmulps_avx512f(auVar35,auVar35);
      auVar40 = vaddps_avx512f(auVar35,auVar29);
      auVar41 = vmulps_avx512f(auVar39,auVar35);
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar35,auVar30);
      auVar35 = vfmadd213ps_avx512f(auVar38,auVar35,auVar22);
      auVar36 = vaddps_avx512f(auVar36,auVar31);
      auVar38 = vmulps_avx512f(auVar32,*(undefined1 (*) [64])(pfVar4 + uVar15));
      auVar36 = vcvttps2dq_avx512f(auVar36);
      auVar35 = vfmadd231ps_avx512f(auVar35,auVar41,auVar37);
      auVar36 = vpslld_avx512f(auVar36,0x17);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar39,auVar40);
      auVar35 = vmulps_avx512f(auVar35,auVar36);
      auVar34 = vmaxps_avx512f(auVar34,auVar35);
      auVar34 = vfmadd213ps_avx512f(auVar38,auVar34,*(undefined1 (*) [64])(pfVar2 + uVar15));
      *(undefined1 (*) [64])(pfVar2 + uVar15) = auVar34;
      uVar15 = uVar15 + 0x10;
    } while ((long)uVar15 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar11) {
    do {
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar18 = vxorps_avx512vl(ZEXT416((uint)pfVar3[uVar16]),auVar6);
      auVar25._0_4_ = expf(pfVar3[uVar16] * auVar18._0_4_);
      auVar25._4_60_ = extraout_var_00;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)(pfVar4[uVar16] * 1.1283792)),auVar25._0_16_,
                                ZEXT416((uint)pfVar2[uVar16]));
      pfVar2[uVar16] = auVar18._0_4_;
      uVar16 = uVar16 + 1;
    } while (uVar11 != uVar16);
  }
  return;
}

Assistant:

void Erf::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Erf not yet implemented for CUDA");
#else
  dEdxi.vec() += xs[0]->vec().binaryExpr(dEdf.vec(), scalar_erf_backward_op<float>());
#endif
}